

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::_get_permute_axes<unsigned_int>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,char *permut,
          uint *param_2)

{
  char cVar1;
  uint *puVar2;
  CImgArgumentException *this_00;
  long lVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  char cVar12;
  int iVar13;
  char *pcVar14;
  char cVar15;
  ulong uVar16;
  uint *puVar17;
  long lVar18;
  CImg<unsigned_int> res;
  
  puVar17 = this->_data;
  if (((this->_depth == 0 || this->_height == 0) || (this->_width == 0 || puVar17 == (uint *)0x0))
     || (uVar5 = this->_spectrum, permut == (char *)0x0 || uVar5 == 0)) {
    CImg(__return_storage_ptr__,this,false);
    return __return_storage_ptr__;
  }
  res._data = (uint *)0x0;
  res._width = 0;
  res._height = 0;
  res._depth = 0;
  res._spectrum = 0;
  res._is_shared = false;
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "xyzc"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) {
        lVar3 = 0;
        goto LAB_0013cb0a;
      }
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  CImg(__return_storage_ptr__,this,false);
  goto LAB_0013e621;
  while (lVar3 = lVar3 + 1, (int)lVar3 != 4) {
LAB_0013cb0a:
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "xycz"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013cc0f;
      break;
    }
  }
  assign(&res,this->_width,this->_height,uVar5,this->_depth);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    lVar6 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        lVar7 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar9 = this->_width;
            iVar13 = 0;
            do {
              if (0 < (int)uVar9) {
                iVar10 = 0;
                do {
                  uVar5 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[lVar3 * lVar6 +
                            (res._8_8_ & 0xffffffff) * lVar3 * lVar7 +
                            (ulong)(res._width * iVar13 + iVar10)] = uVar5;
                  iVar10 = iVar10 + 1;
                  uVar9 = this->_width;
                } while (iVar10 < (int)uVar9);
                uVar5 = this->_height;
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 < (int)uVar5);
            uVar9 = this->_depth;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)uVar5);
  }
LAB_0013cc0f:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "xzyc"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013cd23;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_width,this->_depth,this->_height,uVar5);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    lVar6 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        iVar13 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar9 = this->_width;
            lVar7 = 0;
            do {
              if (0 < (int)uVar9) {
                iVar10 = 0;
                do {
                  uVar5 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[(res._8_8_ & 0xffffffff) * lVar3 * lVar6 +
                            lVar3 * lVar7 + (ulong)(res._width * iVar13 + iVar10)] = uVar5;
                  iVar10 = iVar10 + 1;
                  uVar9 = this->_width;
                } while (iVar10 < (int)uVar9);
                uVar5 = this->_height;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < (int)uVar5);
            uVar9 = this->_depth;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)uVar5);
  }
LAB_0013cd23:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "xzcy"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013ce36;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_width,this->_depth,uVar5,this->_height);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    lVar6 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        iVar13 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar9 = this->_width;
            lVar7 = 0;
            do {
              if (0 < (int)uVar9) {
                iVar10 = 0;
                do {
                  uVar5 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[lVar3 * lVar6 +
                            (res._8_8_ & 0xffffffff) * lVar3 * lVar7 +
                            (ulong)(res._width * iVar13 + iVar10)] = uVar5;
                  iVar10 = iVar10 + 1;
                  uVar9 = this->_width;
                } while (iVar10 < (int)uVar9);
                uVar5 = this->_height;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < (int)uVar5);
            uVar9 = this->_depth;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)uVar5);
  }
LAB_0013ce36:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "xcyz"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013cf46;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_width,uVar5,this->_height,this->_depth);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        lVar6 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar9 = this->_width;
            lVar7 = 0;
            do {
              if (0 < (int)uVar9) {
                iVar10 = 0;
                do {
                  uVar5 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[(res._8_8_ & 0xffffffff) * lVar3 * lVar6 +
                            lVar3 * lVar7 + (ulong)(res._width * iVar13 + iVar10)] = uVar5;
                  iVar10 = iVar10 + 1;
                  uVar9 = this->_width;
                } while (iVar10 < (int)uVar9);
                uVar5 = this->_height;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < (int)uVar5);
            uVar9 = this->_depth;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar5);
  }
LAB_0013cf46:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "xczy"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013d056;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_width,uVar5,this->_depth,this->_height);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        lVar6 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar9 = this->_width;
            lVar7 = 0;
            do {
              if (0 < (int)uVar9) {
                iVar10 = 0;
                do {
                  uVar5 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[lVar3 * lVar6 +
                            (res._8_8_ & 0xffffffff) * lVar3 * lVar7 +
                            (ulong)(res._width * iVar13 + iVar10)] = uVar5;
                  iVar10 = iVar10 + 1;
                  uVar9 = this->_width;
                } while (iVar10 < (int)uVar9);
                uVar5 = this->_height;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < (int)uVar5);
            uVar9 = this->_depth;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar5);
  }
LAB_0013d056:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "yxzc"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013d16a;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_height,this->_width,this->_depth,uVar5);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    lVar6 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        lVar7 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar9 = this->_width;
            iVar13 = 0;
            do {
              if (0 < (int)uVar9) {
                iVar10 = 0;
                do {
                  uVar5 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[lVar3 * lVar7 +
                            (res._8_8_ & 0xffffffff) * lVar3 * lVar6 +
                            (ulong)(res._width * iVar10 + iVar13)] = uVar5;
                  iVar10 = iVar10 + 1;
                  uVar9 = this->_width;
                } while (iVar10 < (int)uVar9);
                uVar5 = this->_height;
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 < (int)uVar5);
            uVar9 = this->_depth;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)uVar5);
  }
LAB_0013d16a:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "yxcz"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013d280;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_height,this->_width,uVar5,this->_depth);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    lVar6 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        lVar7 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar9 = this->_width;
            iVar13 = 0;
            do {
              if (0 < (int)uVar9) {
                iVar10 = 0;
                do {
                  uVar5 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[lVar3 * lVar6 +
                            (res._8_8_ & 0xffffffff) * lVar3 * lVar7 +
                            (ulong)(res._width * iVar10 + iVar13)] = uVar5;
                  iVar10 = iVar10 + 1;
                  uVar9 = this->_width;
                } while (iVar10 < (int)uVar9);
                uVar5 = this->_height;
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 < (int)uVar5);
            uVar9 = this->_depth;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)uVar5);
  }
LAB_0013d280:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "yzxc"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013d38f;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_height,this->_depth,this->_width,uVar5);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    lVar6 = 0;
    lVar7 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        iVar13 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar16 = (ulong)this->_width;
            iVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                lVar18 = 0;
                lVar4 = 0;
                lVar11 = (long)res._data + lVar6;
                do {
                  *(uint *)(lVar11 + (ulong)(res._width * iVar13 + iVar10) * 4) = puVar17[lVar4];
                  lVar4 = lVar4 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  lVar11 = lVar11 + lVar3 * 4;
                  lVar18 = lVar18 + 4;
                } while (lVar4 < (long)uVar16);
                uVar5 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar18);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)uVar5);
            uVar9 = this->_depth;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
    } while (lVar7 < (int)uVar5);
  }
LAB_0013d38f:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "yzcx"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013d560;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_height,this->_depth,uVar5,this->_width);
  uVar16 = (ulong)this->_width;
  switch(this->_width) {
  case 1:
    iVar13 = this->_depth * this->_height * this->_spectrum;
    if (iVar13 != 0) {
      lVar3 = 0;
      do {
        uVar5 = *puVar17;
        puVar17 = puVar17 + 1;
        res._data[lVar3] = uVar5;
        lVar3 = lVar3 + 1;
      } while (iVar13 != (int)lVar3);
    }
    break;
  case 2:
    iVar13 = this->_depth * this->_height * this->_spectrum;
    if (iVar13 != 0) {
      lVar3 = 0;
      do {
        res._data[lVar3] = *puVar17;
        puVar8 = puVar17 + 1;
        puVar17 = puVar17 + 2;
        res._data[(ulong)(res._height * res._width * res._depth) + lVar3] = *puVar8;
        lVar3 = lVar3 + 1;
      } while (iVar13 != (int)lVar3);
    }
    break;
  case 3:
    iVar13 = this->_depth * this->_height * this->_spectrum;
    if (iVar13 != 0) {
      uVar5 = res._height * res._width * res._depth;
      lVar3 = 0;
      do {
        res._data[lVar3] = *puVar17;
        res._data[(ulong)uVar5 + lVar3] = puVar17[1];
        puVar8 = puVar17 + 2;
        puVar17 = puVar17 + 3;
        res._data[(ulong)(uVar5 * 2) + lVar3] = *puVar8;
        lVar3 = lVar3 + 1;
      } while (iVar13 != (int)lVar3);
    }
    break;
  case 4:
    iVar13 = this->_depth * this->_height * this->_spectrum;
    if (iVar13 != 0) {
      uVar5 = res._height * res._width * res._depth;
      lVar3 = 0;
      do {
        res._data[lVar3] = *puVar17;
        res._data[(ulong)uVar5 + lVar3] = puVar17[1];
        res._data[(ulong)(uVar5 * 2) + lVar3] = puVar17[2];
        puVar8 = puVar17 + 3;
        puVar17 = puVar17 + 4;
        res._data[(ulong)(uVar5 * 3) + lVar3] = *puVar8;
        lVar3 = lVar3 + 1;
      } while (iVar13 != (int)lVar3);
    }
    break;
  default:
    uVar5 = this->_spectrum;
    if (0 < (int)uVar5) {
      lVar3 = (ulong)res._height * (res._0_8_ & 0xffffffff);
      uVar9 = this->_depth;
      lVar6 = 0;
      lVar7 = 0;
      do {
        if (0 < (int)uVar9) {
          uVar5 = this->_height;
          iVar13 = 0;
          do {
            if (0 < (int)uVar5) {
              iVar10 = 0;
              do {
                if (0 < (int)uVar16) {
                  lVar18 = 0;
                  lVar4 = 0;
                  lVar11 = (long)res._data + lVar6;
                  do {
                    *(uint *)(lVar11 + (ulong)(res._width * iVar13 + iVar10) * 4) = puVar17[lVar4];
                    lVar4 = lVar4 + 1;
                    uVar16 = (ulong)(int)this->_width;
                    lVar11 = lVar11 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
                    lVar18 = lVar18 + 4;
                  } while (lVar4 < (long)uVar16);
                  uVar5 = this->_height;
                  puVar17 = (uint *)((long)puVar17 + lVar18);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)uVar5);
              uVar9 = this->_depth;
            }
            iVar13 = iVar13 + 1;
          } while (iVar13 < (int)uVar9);
          uVar5 = this->_spectrum;
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + lVar3 * 4;
      } while (lVar7 < (int)uVar5);
    }
    CImg(__return_storage_ptr__,&res);
    goto LAB_0013e621;
  }
LAB_0013d560:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "ycxz"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013d66c;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_height,this->_spectrum,this->_width,this->_depth);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        lVar6 = 0;
        lVar7 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar16 = (ulong)this->_width;
            iVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                lVar18 = 0;
                lVar4 = 0;
                lVar11 = (long)res._data + lVar6;
                do {
                  *(uint *)(lVar11 + (ulong)(res._width * iVar13 + iVar10) * 4) = puVar17[lVar4];
                  lVar4 = lVar4 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  lVar11 = lVar11 + lVar3 * 4;
                  lVar18 = lVar18 + 4;
                } while (lVar4 < (long)uVar16);
                uVar5 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar18);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)uVar5);
            uVar9 = this->_depth;
          }
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
        } while (lVar7 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar5);
  }
LAB_0013d66c:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "yczx"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013d77c;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_height,this->_spectrum,this->_depth,this->_width);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        lVar6 = 0;
        lVar7 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar16 = (ulong)this->_width;
            iVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                lVar18 = 0;
                lVar4 = 0;
                lVar11 = (long)res._data + lVar6;
                do {
                  *(uint *)(lVar11 + (ulong)(res._width * iVar13 + iVar10) * 4) = puVar17[lVar4];
                  lVar4 = lVar4 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  lVar11 = lVar11 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
                  lVar18 = lVar18 + 4;
                } while (lVar4 < (long)uVar16);
                uVar5 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar18);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)uVar5);
            uVar9 = this->_depth;
          }
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + lVar3 * 4;
        } while (lVar7 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar5);
  }
LAB_0013d77c:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "zxyc"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013d88b;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_depth,this->_width,this->_height,this->_spectrum);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    lVar6 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        iVar13 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar9 = this->_width;
            lVar7 = 0;
            do {
              if (0 < (int)uVar9) {
                iVar10 = 0;
                do {
                  uVar5 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[(res._8_8_ & 0xffffffff) * lVar3 * lVar6 +
                            lVar3 * lVar7 + (ulong)(res._width * iVar10 + iVar13)] = uVar5;
                  iVar10 = iVar10 + 1;
                  uVar9 = this->_width;
                } while (iVar10 < (int)uVar9);
                uVar5 = this->_height;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < (int)uVar5);
            uVar9 = this->_depth;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)uVar5);
  }
LAB_0013d88b:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "zxcy"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013d99a;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_depth,this->_width,this->_spectrum,this->_height);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    lVar6 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        iVar13 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar9 = this->_width;
            lVar7 = 0;
            do {
              if (0 < (int)uVar9) {
                iVar10 = 0;
                do {
                  uVar5 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[lVar3 * lVar6 +
                            (res._8_8_ & 0xffffffff) * lVar3 * lVar7 +
                            (ulong)(res._width * iVar10 + iVar13)] = uVar5;
                  iVar10 = iVar10 + 1;
                  uVar9 = this->_width;
                } while (iVar10 < (int)uVar9);
                uVar5 = this->_height;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < (int)uVar5);
            uVar9 = this->_depth;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)uVar5);
  }
LAB_0013d99a:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "zyxc"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013daa7;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_depth,this->_height,this->_width,this->_spectrum);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    lVar6 = 0;
    lVar7 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        iVar13 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar16 = (ulong)this->_width;
            iVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                lVar18 = 0;
                lVar4 = 0;
                lVar11 = (long)res._data + lVar6;
                do {
                  *(uint *)(lVar11 + (ulong)(res._width * iVar10 + iVar13) * 4) = puVar17[lVar4];
                  lVar4 = lVar4 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  lVar11 = lVar11 + lVar3 * 4;
                  lVar18 = lVar18 + 4;
                } while (lVar4 < (long)uVar16);
                uVar5 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar18);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)uVar5);
            uVar9 = this->_depth;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
    } while (lVar7 < (int)uVar5);
  }
LAB_0013daa7:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "zycx"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013dbb8;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_depth,this->_height,this->_spectrum,this->_width);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    lVar6 = 0;
    lVar7 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        iVar13 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar16 = (ulong)this->_width;
            iVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                lVar18 = 0;
                lVar4 = 0;
                lVar11 = (long)res._data + lVar6;
                do {
                  *(uint *)(lVar11 + (ulong)(res._width * iVar10 + iVar13) * 4) = puVar17[lVar4];
                  lVar4 = lVar4 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  lVar11 = lVar11 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
                  lVar18 = lVar18 + 4;
                } while (lVar4 < (long)uVar16);
                uVar5 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar18);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)uVar5);
            uVar9 = this->_depth;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + lVar3 * 4;
    } while (lVar7 < (int)uVar5);
  }
LAB_0013dbb8:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "zcxy"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013dcbc;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_depth,this->_spectrum,this->_width,this->_height);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        iVar10 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar16 = (ulong)this->_width;
            lVar6 = 0;
            puVar8 = res._data;
            do {
              if (0 < (int)uVar16) {
                lVar7 = 0;
                lVar11 = 0;
                puVar2 = puVar8;
                do {
                  puVar2[res._width * iVar13 + iVar10] = puVar17[lVar11];
                  lVar11 = lVar11 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  puVar2 = puVar2 + lVar3;
                  lVar7 = lVar7 + 4;
                } while (lVar11 < (long)uVar16);
                uVar5 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar7);
              }
              lVar6 = lVar6 + 1;
              puVar8 = puVar8 + (res._8_8_ & 0xffffffff) * lVar3;
            } while (lVar6 < (int)uVar5);
            uVar9 = this->_depth;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar5);
  }
LAB_0013dcbc:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "zcyx"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013ddc4;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_depth,this->_spectrum,this->_height,this->_width);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        iVar10 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar16 = (ulong)this->_width;
            lVar6 = 0;
            puVar8 = res._data;
            do {
              if (0 < (int)uVar16) {
                lVar7 = 0;
                lVar11 = 0;
                puVar2 = puVar8;
                do {
                  puVar2[res._width * iVar13 + iVar10] = puVar17[lVar11];
                  lVar11 = lVar11 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  puVar2 = puVar2 + (res._8_8_ & 0xffffffff) * lVar3;
                  lVar7 = lVar7 + 4;
                } while (lVar11 < (long)uVar16);
                uVar5 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar7);
              }
              lVar6 = lVar6 + 1;
              puVar8 = puVar8 + lVar3;
            } while (lVar6 < (int)uVar5);
            uVar9 = this->_depth;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar5);
  }
LAB_0013ddc4:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "cxyz"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013e0db;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_spectrum,this->_width,this->_height,this->_depth);
  uVar5 = this->_spectrum;
  switch(uVar5) {
  case 1:
    iVar13 = this->_height * this->_width * this->_depth;
    if (iVar13 != 0) {
      puVar8 = this->_data;
      lVar3 = 0;
      do {
        res._data[lVar3] = puVar8[lVar3];
        lVar3 = lVar3 + 1;
      } while (iVar13 != (int)lVar3);
    }
    break;
  case 2:
    uVar5 = this->_height * this->_width * this->_depth;
    if (uVar5 != 0) {
      puVar8 = this->_data;
      lVar3 = 0;
      do {
        res._data[lVar3 * 2] = puVar8[lVar3];
        res._data[lVar3 * 2 + 1] = puVar8[(ulong)uVar5 + lVar3];
        lVar3 = lVar3 + 1;
      } while (uVar5 != (uint)lVar3);
    }
    break;
  case 3:
    uVar5 = this->_height * this->_width * this->_depth;
    if (uVar5 != 0) {
      puVar8 = this->_data;
      lVar3 = 0;
      puVar2 = res._data;
      do {
        *puVar2 = puVar8[lVar3];
        puVar2[1] = puVar8[(ulong)uVar5 + lVar3];
        puVar2[2] = puVar8[(ulong)(uVar5 * 2) + lVar3];
        lVar3 = lVar3 + 1;
        puVar2 = puVar2 + 3;
      } while (uVar5 != (uint)lVar3);
    }
    break;
  case 4:
    uVar5 = this->_height * this->_width * this->_depth;
    if (uVar5 != 0) {
      puVar8 = this->_data;
      lVar3 = 0;
      puVar2 = res._data;
      do {
        *puVar2 = puVar8[lVar3];
        puVar2[1] = puVar8[(ulong)uVar5 + lVar3];
        puVar2[2] = puVar8[(ulong)(uVar5 * 2) + lVar3];
        puVar2[3] = puVar8[(ulong)(uVar5 * 3) + lVar3];
        lVar3 = lVar3 + 1;
        puVar2 = puVar2 + 4;
      } while (uVar5 != (uint)lVar3);
    }
    break;
  default:
    if (0 < (int)uVar5) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      uVar9 = this->_depth;
      iVar13 = 0;
      do {
        if (0 < (int)uVar9) {
          uVar5 = this->_height;
          lVar6 = 0;
          do {
            if (0 < (int)uVar5) {
              uVar9 = this->_width;
              lVar7 = 0;
              do {
                if (0 < (int)uVar9) {
                  iVar10 = 0;
                  do {
                    uVar5 = *puVar17;
                    puVar17 = puVar17 + 1;
                    res._data[(res._8_8_ & 0xffffffff) * lVar3 * lVar6 +
                              lVar3 * lVar7 + (ulong)(res._width * iVar10 + iVar13)] = uVar5;
                    iVar10 = iVar10 + 1;
                    uVar9 = this->_width;
                  } while (iVar10 < (int)uVar9);
                  uVar5 = this->_height;
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)uVar5);
              uVar9 = this->_depth;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < (int)uVar9);
          uVar5 = this->_spectrum;
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 < (int)uVar5);
    }
  }
LAB_0013e0db:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "cxzy"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013e1e4;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_spectrum,this->_width,this->_depth,this->_height);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        lVar6 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar9 = this->_width;
            lVar7 = 0;
            do {
              if (0 < (int)uVar9) {
                iVar10 = 0;
                do {
                  uVar5 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[lVar3 * lVar6 +
                            (res._8_8_ & 0xffffffff) * lVar3 * lVar7 +
                            (ulong)(res._width * iVar10 + iVar13)] = uVar5;
                  iVar10 = iVar10 + 1;
                  uVar9 = this->_width;
                } while (iVar10 < (int)uVar9);
                uVar5 = this->_height;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < (int)uVar5);
            uVar9 = this->_depth;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar5);
  }
LAB_0013e1e4:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "cyxz"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013e2f0;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_spectrum,this->_height,this->_width,this->_depth);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        lVar6 = 0;
        lVar7 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar16 = (ulong)this->_width;
            iVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                lVar18 = 0;
                lVar4 = 0;
                lVar11 = (long)res._data + lVar6;
                do {
                  *(uint *)(lVar11 + (ulong)(res._width * iVar10 + iVar13) * 4) = puVar17[lVar4];
                  lVar4 = lVar4 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  lVar11 = lVar11 + lVar3 * 4;
                  lVar18 = lVar18 + 4;
                } while (lVar4 < (long)uVar16);
                uVar5 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar18);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)uVar5);
            uVar9 = this->_depth;
          }
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
        } while (lVar7 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar5);
  }
LAB_0013e2f0:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "cyzx"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013e400;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_spectrum,this->_height,this->_depth,this->_width);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        lVar6 = 0;
        lVar7 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar16 = (ulong)this->_width;
            iVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                lVar18 = 0;
                lVar4 = 0;
                lVar11 = (long)res._data + lVar6;
                do {
                  *(uint *)(lVar11 + (ulong)(res._width * iVar10 + iVar13) * 4) = puVar17[lVar4];
                  lVar4 = lVar4 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  lVar11 = lVar11 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
                  lVar18 = lVar18 + 4;
                } while (lVar4 < (long)uVar16);
                uVar5 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar18);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)uVar5);
            uVar9 = this->_depth;
          }
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + lVar3 * 4;
        } while (lVar7 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar5);
  }
LAB_0013e400:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "czxy"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013e504;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_spectrum,this->_depth,this->_width,this->_height);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        iVar10 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar16 = (ulong)this->_width;
            lVar6 = 0;
            puVar8 = res._data;
            do {
              if (0 < (int)uVar16) {
                lVar7 = 0;
                lVar11 = 0;
                puVar2 = puVar8;
                do {
                  puVar2[res._width * iVar10 + iVar13] = puVar17[lVar11];
                  lVar11 = lVar11 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  puVar2 = puVar2 + lVar3;
                  lVar7 = lVar7 + 4;
                } while (lVar11 < (long)uVar16);
                uVar5 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar7);
              }
              lVar6 = lVar6 + 1;
              puVar8 = puVar8 + (res._8_8_ & 0xffffffff) * lVar3;
            } while (lVar6 < (int)uVar5);
            uVar9 = this->_depth;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar5);
  }
LAB_0013e504:
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "czyx"[lVar3];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar3 != 4) goto LAB_0013e60c;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  assign(&res,this->_spectrum,this->_depth,this->_height,this->_width);
  uVar5 = this->_spectrum;
  if (0 < (int)uVar5) {
    lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar9 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar5 = this->_height;
        iVar10 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar16 = (ulong)this->_width;
            lVar6 = 0;
            puVar8 = res._data;
            do {
              if (0 < (int)uVar16) {
                lVar7 = 0;
                lVar11 = 0;
                puVar2 = puVar8;
                do {
                  puVar2[res._width * iVar10 + iVar13] = puVar17[lVar11];
                  lVar11 = lVar11 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  puVar2 = puVar2 + (res._8_8_ & 0xffffffff) * lVar3;
                  lVar7 = lVar7 + 4;
                } while (lVar11 < (long)uVar16);
                uVar5 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar7);
              }
              lVar6 = lVar6 + 1;
              puVar8 = puVar8 + lVar3;
            } while (lVar6 < (int)uVar5);
            uVar9 = this->_depth;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < (int)uVar9);
        uVar5 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar5);
  }
LAB_0013e60c:
  if (res._data == (uint *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    pcVar14 = "non-";
    if (this->_is_shared != false) {
      pcVar14 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::permute_axes() : Invalid specified permutation \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar14,"unsigned int",permut);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
  }
  CImg(__return_storage_ptr__,&res);
LAB_0013e621:
  if ((res._is_shared == false) && (res._data != (uint *)0x0)) {
    operator_delete__(res._data);
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<t> _get_permute_axes(const char *const permut, const t&) const {
      if (is_empty() || !permut) return CImg<t>(*this,false);
      CImg<t> res;
      const T* ptrs = _data;
      if (!cimg::strncasecmp(permut,"xyzc",4)) return (+*this);
      if (!cimg::strncasecmp(permut,"xycz",4)) {
        res.assign(_width,_height,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,y,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzyc",4)) {
        res.assign(_width,_depth,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,z,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzcy",4)) {
        res.assign(_width,_depth,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,z,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xcyz",4)) {
        res.assign(_width,_spectrum,_height,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,c,y,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xczy",4)) {
        res.assign(_width,_spectrum,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,c,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxzc",4)) {
        res.assign(_height,_width,_depth,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,x,z,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxcz",4)) {
        res.assign(_height,_width,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,x,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzxc",4)) {
        res.assign(_height,_depth,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,z,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzcx",4)) {
        res.assign(_height,_depth,_spectrum,_width);
        switch (_width) {
        case 1 : {
          t *ptr_r = res.data(0,0,0,0);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++);
          }
        } break;
        case 2 : {
          t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++);
          }
        } break;
        case 3 : { // Optimization for the classical conversion from interleaved RGB to planar RGB
          t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++);
          }
        } break;
        case 4 : { // Optimization for the classical conversion from interleaved RGBA to planar RGBA
          t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2), *ptr_a = res.data(0,0,0,3);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++); *(ptr_a++) = (t)*(ptrs++);
          }
        } break;
        default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,z,c,x,wh,whd) = *(ptrs++);
          return res;
        }
        }
      }
      if (!cimg::strncasecmp(permut,"ycxz",4)) {
        res.assign(_height,_spectrum,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,c,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yczx",4)) {
        res.assign(_height,_spectrum,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,c,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxyc",4)) {
        res.assign(_depth,_width,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,x,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxcy",4)) {
        res.assign(_depth,_width,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,x,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zyxc",4)) {
        res.assign(_depth,_height,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,y,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zycx",4)) {
        res.assign(_depth,_height,_spectrum,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,y,c,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcxy",4)) {
        res.assign(_depth,_spectrum,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,c,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcyx",4)) {
        res.assign(_depth,_spectrum,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,c,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cxyz",4)) {
        res.assign(_spectrum,_width,_height,_depth);
        switch (_spectrum) {
        case 1 : {
          const T *ptr_r = data(0,0,0,0);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++);
          }
        } break;
        case 2 : {
          const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++);
          }
        } break;
        case 3 : { // Optimization for the classical conversion from planar RGB to interleaved RGB
          const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++);
          }
        } break;
        case 4 : { // Optimization for the classical conversion from planar RGBA to interleaved RGBA
          const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++); *(ptrd++) = (t)*(ptr_a++);
          }
        } break;
        default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,x,y,z,wh,whd) = (t)*(ptrs++);
        }
        }
      }
      if (!cimg::strncasecmp(permut,"cxzy",4)) {
        res.assign(_spectrum,_width,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,x,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyxz",4)) {
        res.assign(_spectrum,_height,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,y,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyzx",4)) {
        res.assign(_spectrum,_height,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,y,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czxy",4)) {
        res.assign(_spectrum,_depth,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,z,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czyx",4)) {
        res.assign(_spectrum,_depth,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,z,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!res)
        throw CImgArgumentException(_cimg_instance
                                    "permute_axes() : Invalid specified permutation '%s'.",
                                    cimg_instance,
                                    permut);
      return res;
    }